

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidBranchOutputNotProduced2(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *this;
  FeatureType *pFVar2;
  ArrayFeatureType *this_00;
  ActivationParams *pAVar3;
  NeuralNetwork *this_01;
  ostream *poVar4;
  Result local_110;
  BranchLayerParams *branch_layer;
  NeuralNetworkLayer *l4;
  NeuralNetworkLayer *l3;
  NeuralNetwork *nnMain;
  NeuralNetworkLayer *l1;
  NeuralNetwork nnIf;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  this = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(this,"A");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(this);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(this);
  this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nnIf._80_8_ = CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nnIf._80_8_,"B");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)nnIf._80_8_);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)&l1);
  nnMain = (NeuralNetwork *)CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)&l1);
  pAVar3 = CoreML::Specification::NeuralNetworkLayer::mutable_activation
                     ((NeuralNetworkLayer *)nnMain);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar3);
  CoreML::Specification::NeuralNetworkLayer::set_name((NeuralNetworkLayer *)nnMain,"if_relu");
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)nnMain,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)nnMain,"B");
  l3 = (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping
            ((NeuralNetwork *)l3,EXACT_ARRAY_MAPPING);
  l4 = CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)l3);
  pAVar3 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(l4);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar3);
  CoreML::Specification::NeuralNetworkLayer::set_name(l4,"condition_producing_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input(l4,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(l4,"cond");
  branch_layer = (BranchLayerParams *)
                 CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)l3);
  local_110.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_branch((NeuralNetworkLayer *)branch_layer)
  ;
  CoreML::Specification::NeuralNetworkLayer::set_name
            ((NeuralNetworkLayer *)branch_layer,"branch_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)branch_layer,"cond");
  this_01 = CoreML::Specification::BranchLayerParams::mutable_ifbranch
                      ((BranchLayerParams *)local_110.m_message._M_storage._M_storage);
  CoreML::Specification::NeuralNetwork::CopyFrom(this_01,(NeuralNetwork *)&l1);
  CoreML::validate<(MLModelType)500>(&local_110,(Model *)&topIn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good(&local_110);
  if (m._oneof_case_[0]._0_1_) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x113f);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!((res).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result(&local_110);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)&l1);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidBranchOutputNotProduced2() {
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();
    
    // "If" net
    Specification::NeuralNetwork nnIf;
    auto *l1 = nnIf.add_layers();
    (void)l1->mutable_activation()->mutable_relu();
    l1->set_name("if_relu");
    l1->add_input("A");
    l1->add_output("B");
    
    // Main network
    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l3 = nnMain->add_layers();
    (void)l3->mutable_activation()->mutable_relu();
    l3->set_name("condition_producing_layer");
    l3->add_input("A");
    l3->add_output("cond");
    
    auto *l4 = nnMain->add_layers();
    auto *branch_layer = l4->mutable_branch();
    l4->set_name("branch_layer");
    l4->add_input("cond");
    branch_layer->mutable_ifbranch()->CopyFrom(nnIf);
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}